

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O3

bool P_ClipLineToPortal(line_t_conflict *line,line_t_conflict *portal,DVector2 *view,bool partial,
                       bool samebehind)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar17;
  undefined1 auVar16 [16];
  
  dVar12 = (line->v1->p).X;
  dVar17 = (portal->delta).X;
  dVar4 = (portal->delta).Y;
  dVar13 = (portal->v1->p).X;
  dVar1 = (portal->v1->p).Y;
  dVar2 = (line->v1->p).Y;
  dVar15 = (dVar2 - dVar1) * dVar17 + dVar4 * (dVar13 - dVar12);
  dVar17 = (dVar13 - (line->v2->p).X) * dVar4 + dVar17 * ((line->v2->p).Y - dVar1);
  auVar14._8_8_ = -(ulong)(1.52587890625e-05 < dVar17);
  auVar14._0_8_ = -(ulong)(1.52587890625e-05 < dVar15);
  auVar16._8_8_ = -(ulong)(dVar17 < -1.52587890625e-05);
  auVar16._0_8_ = -(ulong)(dVar15 < -1.52587890625e-05);
  auVar16 = packssdw(auVar16,auVar16);
  auVar16 = packssdw(auVar16,auVar16);
  auVar16 = packsswb(auVar16,auVar16);
  auVar14 = packssdw(auVar14,auVar14);
  auVar14 = packssdw(auVar14,auVar14);
  auVar14 = packsswb(auVar14,auVar14);
  auVar16 = auVar14 & _DAT_0060a470 | auVar16;
  bVar5 = true;
  if (auVar16._0_2_ != 0) {
    bVar7 = auVar16[0];
    bVar11 = auVar16[1];
    bVar3 = bVar7;
    if (bVar7 == 0) {
      bVar3 = bVar11;
    }
    if (bVar11 == 0) {
      bVar11 = bVar7;
      bVar3 = bVar7;
    }
    if ((char)bVar3 < '\x01' || (char)bVar11 < '\x01') {
      if ((char)(bVar3 & bVar11) < '\0') {
        return false;
      }
      dVar17 = (line->delta).X;
      dVar4 = (line->delta).Y;
      dVar15 = (dVar12 - view->X) * dVar4 + (view->Y - dVar2) * dVar17;
      uVar6 = (uint)(1.52587890625e-05 < dVar15);
      if (dVar15 < -1.52587890625e-05) {
        uVar6 = 0xffffffff;
      }
      dVar13 = (dVar12 - dVar13) * dVar4 + (dVar1 - dVar2) * dVar17;
      uVar8 = (uint)(1.52587890625e-05 < dVar13);
      if (dVar13 < -1.52587890625e-05) {
        uVar8 = 0xffffffff;
      }
      dVar12 = (dVar12 - (portal->v2->p).X) * dVar4 + ((portal->v2->p).Y - dVar2) * dVar17;
      uVar9 = (uint)(1.52587890625e-05 < dVar12);
      if (dVar12 < -1.52587890625e-05) {
        uVar9 = 0xffffffff;
      }
      uVar10 = uVar8;
      if (uVar8 == 0) {
        uVar10 = uVar9;
      }
      bVar5 = uVar6 != uVar10 && ((uVar8 == 0 || uVar9 == 0) || uVar9 == uVar8);
    }
  }
  return bVar5;
}

Assistant:

bool P_ClipLineToPortal(line_t* line, line_t* portal, DVector2 view, bool partial, bool samebehind)
{
	int behind1 = P_GetLineSide(line->v1->fPos(), portal);
	int behind2 = P_GetLineSide(line->v2->fPos(), portal);

	if (behind1 == 0 && behind2 == 0)
	{
		// The line is parallel to the portal and cannot possibly be visible.
		return true;
	}
	// If one point lies on the same straight line than the portal, the other vertex will determine sidedness alone.
	else if (behind2 == 0) behind2 = behind1;
	else if (behind1 == 0) behind1 = behind2;

	if (behind1 > 0 && behind2 > 0)
	{
		// The line is behind the portal, i.e. between viewer and portal line, and must be rejected
		return true;
	}
	else if (behind1 < 0 && behind2 < 0)
	{
		// The line is in front of the portal, i.e. the portal is between viewer and line. This line must not be rejected
		return false;
	}
	else
	{
		// The line intersects with the portal straight, so we need to do another check to see how both ends of the portal lie in relation to the viewer.
		int viewside = P_GetLineSide(view, line); 
		int p1side = P_GetLineSide(portal->v1->fPos(), line);
		int p2side = P_GetLineSide(portal->v2->fPos(), line);
		// Do the same handling of points on the portal straight as above.
		if (p1side == 0) p1side = p2side;
		else if (p2side == 0) p2side = p1side;
		// If the portal is on the other side of the line than the viewpoint, there is no possibility to see this line inside the portal.
		return (p1side == p2side && viewside != p1side);
	}
}